

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O1

void __thiscall QTreeWidgetItem::setData(QTreeWidgetItem *this,int column,int role,QVariant *value)

{
  QList<QList<QWidgetItemData>_> *this_00;
  uint uVar1;
  QList<QWidgetItemData> *pQVar2;
  ulong uVar3;
  bool bVar4;
  bool bVar5;
  byte bVar6;
  char cVar7;
  QTreeModel *this_01;
  long lVar8;
  pointer pQVar9;
  pointer pQVar10;
  pointer pQVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  undefined8 uVar16;
  QVariantList *pQVar17;
  QTreeWidgetItem *pQVar18;
  long in_FS_OFFSET;
  QArrayData *d;
  QArrayDataPointer<QWidgetItemData> local_a8;
  undefined1 local_88 [8];
  QVariant QStack_80;
  QVariant local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (column < 0) goto LAB_005bd9cd;
  uVar3 = (ulong)(uint)column;
  this_01 = treeModel(this,(QTreeWidget *)0x0);
  if (role == 0) {
LAB_005bd50d:
    if ((ulong)(this->values).d.size <= uVar3) {
      if ((this_01 == (QTreeModel *)0x0) || (this_01->headerItem != this)) {
        QList<QList<QWidgetItemData>_>::resize(&this->values,(ulong)(column + 1));
      }
      else {
        QTreeModel::setColumnCount(this_01,column + 1);
      }
    }
    uVar14 = (this->d->display).d.size;
    if (uVar3 < uVar14) {
      pQVar10 = QList<QVariant>::data(&this->d->display);
      cVar7 = ::QVariant::equals(pQVar10 + uVar3);
      if (cVar7 != '\0') goto LAB_005bd9cd;
      pQVar10 = QList<QVariant>::data(&this->d->display);
      ::QVariant::operator=(pQVar10 + uVar3,value);
    }
    else {
      iVar13 = (int)uVar14;
      if (iVar13 + -1 < column + -1) {
        iVar13 = column - iVar13;
        do {
          local_88 = (undefined1  [8])0x0;
          QStack_80.d.data._0_8_ = (int *)0x0;
          QStack_80.d.data._8_8_ = 0;
          QStack_80.d.data._16_8_ = 2;
          pQVar17 = &this->d->display;
          QtPrivate::QMovableArrayOps<QVariant>::emplace<QVariant>
                    ((QMovableArrayOps<QVariant> *)pQVar17,(this->d->display).d.size,
                     (QVariant *)local_88);
          QList<QVariant>::end(pQVar17);
          ::QVariant::~QVariant((QVariant *)local_88);
          iVar13 = iVar13 + -1;
        } while (iVar13 != 0);
      }
      pQVar17 = &this->d->display;
      QtPrivate::QMovableArrayOps<QVariant>::emplace<QVariant_const&>
                ((QMovableArrayOps<QVariant> *)pQVar17,(this->d->display).d.size,value);
      QList<QVariant>::end(pQVar17);
    }
LAB_005bd89e:
    if (this_01 == (QTreeModel *)0x0) goto LAB_005bd9cd;
  }
  else {
    if (role == 10) {
      uVar1 = (this->itemFlags).super_QFlagsStorageHelper<Qt::ItemFlag,_4>.
              super_QFlagsStorage<Qt::ItemFlag>.i;
      if ((uVar1 & 0x40) == 0) {
        bVar6 = 0;
      }
      else {
        ::QVariant::QVariant(&local_58,1);
        bVar6 = ::QVariant::equals(value);
        bVar6 = bVar6 ^ 1;
      }
      if ((uVar1 & 0x40) != 0) {
        ::QVariant::~QVariant(&local_58);
      }
      if ((bVar6 != 0) && ((this->children).d.size != 0)) {
        uVar14 = 0;
        do {
          pQVar18 = (this->children).d.ptr[uVar14];
          (*pQVar18->_vptr_QTreeWidgetItem[3])((QVariant *)local_88,pQVar18,uVar3,10);
          uVar16 = QStack_80.d.data._16_8_;
          ::QVariant::~QVariant((QVariant *)local_88);
          if (3 < (ulong)uVar16) {
            uVar1 = (this->itemFlags).super_QFlagsStorageHelper<Qt::ItemFlag,_4>.
                    super_QFlagsStorage<Qt::ItemFlag>.i;
            (this->itemFlags).super_QFlagsStorageHelper<Qt::ItemFlag,_4>.
            super_QFlagsStorage<Qt::ItemFlag>.i = uVar1 & 0xffffffbf;
            (*pQVar18->_vptr_QTreeWidgetItem[4])(pQVar18,uVar3,10,value);
            (this->itemFlags).super_QFlagsStorageHelper<Qt::ItemFlag,_4>.
            super_QFlagsStorage<Qt::ItemFlag>.i = uVar1;
          }
          uVar14 = uVar14 + 1;
        } while (uVar14 < (ulong)(this->children).d.size);
      }
    }
    else if (role == 2) goto LAB_005bd50d;
    this_00 = &this->values;
    if ((ulong)(this->values).d.size <= uVar3) {
      if ((this_01 == (QTreeModel *)0x0) || (this_01->headerItem != this)) {
        QList<QList<QWidgetItemData>_>::resize(this_00,(ulong)(column + 1));
      }
      else {
        QTreeModel::setColumnCount(this_01,column + 1);
      }
      pQVar9 = QList<QList<QWidgetItemData>_>::data(this_00);
      pQVar2 = pQVar9 + uVar3;
      local_88._0_4_ = role;
      ::QVariant::QVariant(&QStack_80,value);
      QtPrivate::QMovableArrayOps<QWidgetItemData>::emplace<QWidgetItemData>
                ((QMovableArrayOps<QWidgetItemData> *)pQVar2,(pQVar2->d).size,
                 (QWidgetItemData *)local_88);
      QList<QWidgetItemData>::end(pQVar2);
      ::QVariant::~QVariant(&QStack_80);
      goto LAB_005bd89e;
    }
    pQVar2 = (this->values).d.ptr;
    local_a8.d = pQVar2[uVar3].d.d;
    local_a8.ptr = pQVar2[uVar3].d.ptr;
    local_a8.size = pQVar2[uVar3].d.size;
    if (&(local_a8.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_a8.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_a8.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    bVar4 = true;
    if (local_a8.size != 0) {
      lVar15 = -8;
      lVar12 = 0;
      lVar8 = local_a8.size;
      do {
        if (*(int *)((long)&(local_a8.ptr)->role + lVar12) == role) {
          cVar7 = ::QVariant::equals((QVariant *)((long)local_a8.ptr - lVar15));
          if (cVar7 == '\0') {
            pQVar9 = QList<QList<QWidgetItemData>_>::data(this_00);
            pQVar11 = QList<QWidgetItemData>::data(pQVar9 + uVar3);
            ::QVariant::operator=((QVariant *)((long)pQVar11 - lVar15),value);
            bVar5 = true;
            bVar4 = true;
          }
          else {
            bVar5 = false;
            bVar4 = false;
          }
          goto LAB_005bd698;
        }
        lVar15 = lVar15 + -0x28;
        lVar12 = lVar12 + 0x28;
        lVar8 = lVar8 + -1;
      } while (lVar8 != 0);
    }
    bVar5 = false;
LAB_005bd698:
    if (!bVar4) {
      QArrayDataPointer<QWidgetItemData>::~QArrayDataPointer(&local_a8);
      goto LAB_005bd9cd;
    }
    if (!bVar5) {
      pQVar9 = QList<QList<QWidgetItemData>_>::data(this_00);
      pQVar2 = pQVar9 + uVar3;
      local_88._0_4_ = role;
      ::QVariant::QVariant(&QStack_80,value);
      QtPrivate::QMovableArrayOps<QWidgetItemData>::emplace<QWidgetItemData>
                ((QMovableArrayOps<QWidgetItemData> *)pQVar2,(pQVar2->d).size,
                 (QWidgetItemData *)local_88);
      QList<QWidgetItemData>::end(pQVar2);
      ::QVariant::~QVariant(&QStack_80);
    }
    QArrayDataPointer<QWidgetItemData>::~QArrayDataPointer(&local_a8);
    if (!(bool)(this_01 != (QTreeModel *)0x0 & bVar4)) goto LAB_005bd9cd;
  }
  QStack_80.d.data._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_88 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
  QStack_80.d.data._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  if ((role & 0xfffffffdU) == 0) {
    local_a8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    uVar16 = 2;
    QStack_80.d.data.shared =
         (PrivateShared *)QArrayData::allocate((QArrayData **)&local_a8,4,0x10,2,KeepSize);
    *(int *)((long)QStack_80.d.data.shared + 0) = 0;
    *(int *)((long)QStack_80.d.data.shared + 4) = 2;
  }
  else {
    local_a8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    uVar16 = 1;
    QStack_80.d.data.shared =
         (PrivateShared *)QArrayData::allocate((QArrayData **)&local_a8,4,0x10,1,KeepSize);
    *(int *)QStack_80.d.data.shared = role;
  }
  local_88 = (undefined1  [8])local_a8.d;
  QStack_80.d.data._8_8_ = uVar16;
  QTreeModel::emitDataChanged(this_01,this,column,(QList<int> *)local_88);
  pQVar18 = this->par;
  if (pQVar18 != (QTreeWidgetItem *)0x0 && role == 10) {
    do {
      if (((pQVar18->itemFlags).super_QFlagsStorageHelper<Qt::ItemFlag,_4>.
           super_QFlagsStorage<Qt::ItemFlag>.i & 0x40) == 0) break;
      QTreeModel::emitDataChanged(this_01,pQVar18,column,(QList<int> *)local_88);
      pQVar18 = pQVar18->par;
    } while (pQVar18 != (QTreeWidgetItem *)0x0);
  }
  if (local_88 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)local_88 = *(int *)local_88 + -1;
    UNLOCK();
    if (*(int *)local_88 == 0) {
      QArrayData::deallocate((QArrayData *)local_88,4,0x10);
    }
  }
LAB_005bd9cd:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTreeWidgetItem::setData(int column, int role, const QVariant &value)
{
    if (column < 0)
        return;

    QTreeModel *model = treeModel();
    switch (role) {
    case Qt::EditRole:
    case Qt::DisplayRole: {
        if (values.size() <= column) {
            if (model && this == model->headerItem)
                model->setColumnCount(column + 1);
            else
                values.resize(column + 1);
        }
        if (d->display.size() <= column) {
            for (int i = d->display.size() - 1; i < column - 1; ++i)
                d->display.append(QVariant());
            d->display.append(value);
        } else if (d->display[column] != value) {
            d->display[column] = value;
        } else {
            return; // value is unchanged
        }
    } break;
    case Qt::CheckStateRole:
        if ((itemFlags & Qt::ItemIsAutoTristate) && value != Qt::PartiallyChecked) {
            for (int i = 0; i < children.size(); ++i) {
                QTreeWidgetItem *child = children.at(i);
                if (child->data(column, role).isValid()) {// has a CheckState
                    Qt::ItemFlags f = itemFlags; // a little hack to avoid multiple dataChanged signals
                    itemFlags &= ~Qt::ItemIsAutoTristate;
                    child->setData(column, role, value);
                    itemFlags = f;
                }
            }
        }
        Q_FALLTHROUGH();
    default:
        if (column < values.size()) {
            bool found = false;
            const QList<QWidgetItemData> column_values = values.at(column);
            for (int i = 0; i < column_values.size(); ++i) {
                if (column_values.at(i).role == role) {
                    if (column_values.at(i).value == value)
                        return; // value is unchanged
                    values[column][i].value = value;
                    found = true;
                    break;
                }
            }
            if (!found)
                values[column].append(QWidgetItemData(role, value));
        } else {
            if (model && this == model->headerItem)
                model->setColumnCount(column + 1);
            else
                values.resize(column + 1);
            values[column].append(QWidgetItemData(role, value));
        }
    }

    if (model) {
        const QList<int> roles((role == Qt::DisplayRole || role == Qt::EditRole)
                                       ? QList<int>({ Qt::DisplayRole, Qt::EditRole })
                                       : QList<int>({ role }));
        model->emitDataChanged(this, column, roles);
        if (role == Qt::CheckStateRole) {
            QTreeWidgetItem *p;
            for (p = par; p && (p->itemFlags & Qt::ItemIsAutoTristate); p = p->par)
                model->emitDataChanged(p, column, roles);
        }
    }
}